

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.hpp
# Opt level: O0

IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> * __thiscall
MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices
          (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
           *__return_storage_ptr__,Span<const_int,_18446744073709551615UL> *this,size_t sliceSize)

{
  size_t sVar1;
  range_error *this_00;
  pointer ptVar2;
  SliceIterator local_48;
  SliceIterator local_38 [2];
  ulong local_18;
  size_t sliceSize_local;
  Span<const_int,_18446744073709551615UL> *this_local;
  
  local_18 = sliceSize;
  sliceSize_local = (size_t)this;
  sVar1 = Size(this);
  if (sVar1 % local_18 != 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"index out of bounds");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  ptVar2 = Data(this);
  SliceIterator::SliceIterator(local_38,ptVar2,local_18);
  ptVar2 = Data(this);
  sVar1 = Size(this);
  SliceIterator::SliceIterator(&local_48,ptVar2 + sVar1,local_18);
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>::
  IteratorProvider(__return_storage_ptr__,local_38[0],local_48);
  return __return_storage_ptr__;
}

Assistant:

IteratorProvider<SliceIterator> IterateSlices(size_t sliceSize) const
    {
        MILVerifyIsTrue(Size() % sliceSize == 0, std::range_error, "index out of bounds");

        return IteratorProvider<SliceIterator>(SliceIterator(Data(), sliceSize),
                                               SliceIterator(Data() + Size(), sliceSize));
    }